

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_16ac71::SymlinkCommand::isResultValid
          (SymlinkCommand *this,BuildSystem *system,BuildValue *value)

{
  long *plVar1;
  bool bVar2;
  uint uVar3;
  FileInfo *rhs;
  StringRef outputPath;
  FileInfo info;
  StringRef local_a0;
  string local_90;
  FileInfo local_70;
  
  local_a0 = getActualOutputPath(this);
  if ((local_a0.Length != 0 &&
       (this->super_Command).outputs.
       super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->super_Command).outputs.
       super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (((value->kind == SuccessfulCommandWithOutputSignature || (value->kind == SuccessfulCommand))
      && (uVar3 = llbuild::buildsystem::BuildValue::getNumOutputs(value), uVar3 == 1)))) {
    plVar1 = *(long **)((long)system->impl + 0x10);
    llvm::StringRef::str_abi_cxx11_(&local_90,&local_a0);
    (**(code **)(*plVar1 + 0x40))(&local_70,plVar1,&local_90);
    std::__cxx11::string::_M_dispose();
    bVar2 = llbuild::basic::FileInfo::isMissing(&local_70);
    if (!bVar2) {
      rhs = llbuild::buildsystem::BuildValue::getOutputInfo(value);
      bVar2 = llbuild::basic::FileInfo::operator==(&local_70,rhs);
      return bVar2;
    }
  }
  return false;
}

Assistant:

virtual bool isResultValid(BuildSystem& system,
                             const BuildValue& value) override {
    // It is an error if this command isn't configured properly.
    StringRef outputPath = getActualOutputPath();
    if (outputs.empty() || outputPath.empty())
      return false;

    // If the prior value wasn't for a successful command, recompute.
    if (!value.isSuccessfulCommand())
      return false;

    // If the prior command doesn't look like one for a link, recompute.
    if (value.getNumOutputs() != 1)
      return false;

    // Otherwise, assume the result is valid if its link status matches the
    // previous one.
    auto info = system.getFileSystem().getLinkInfo(outputPath);
    if (info.isMissing())
      return false;

    return info == value.getOutputInfo();
  }